

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

double __thiscall
libchars::command_cursor::remainder_abi_cxx11_(command_cursor *this,double __x,double __y)

{
  _Map_pointer pppcVar1;
  _Elt_pointer ppcVar2;
  bool bVar3;
  ulong uVar4;
  const_reference ppcVar5;
  _Elt_pointer ppcVar6;
  stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
  *in_RSI;
  double dVar7;
  allocator<char> local_21;
  value_type local_20;
  command_node *n;
  command_cursor *this_local;
  
  this_local = this;
  bVar3 = std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::empty(in_RSI);
  if (bVar3) {
    if ((in_RSI[1].c.
         super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_last != (_Elt_pointer)0x0) &&
       (pppcVar1 = in_RSI[1].c.
                   super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node,
       ppcVar2 = in_RSI[1].c.
                 super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur,
       uVar4 = std::__cxx11::string::length(), (ulong)((long)pppcVar1 + (long)ppcVar2) < uVar4)) {
      dVar7 = (double)std::__cxx11::string::substr
                                ((ulong)this,
                                 (ulong)in_RSI[1].c.
                                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_last);
      return dVar7;
    }
  }
  else {
    ppcVar5 = std::
              stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              ::top(in_RSI);
    local_20 = *ppcVar5;
    if ((local_20 != (value_type)0x0) &&
       (ppcVar2 = in_RSI[1].c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur,
       ppcVar6 = (_Elt_pointer)std::__cxx11::string::length(), ppcVar2 < ppcVar6)) {
      dVar7 = (double)std::__cxx11::string::substr((ulong)this,(ulong)local_20);
      return dVar7;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_21);
  dVar7 = (double)std::allocator<char>::~allocator(&local_21);
  return dVar7;
}

Assistant:

std::string command_cursor::remainder() const
    {
        if (S.empty()) {
            if (root != NULL && (root_idx + idx) < root->part.length())
                return root->part.substr(root_idx + idx);
        }
        else {
            command_node *n = S.top();
            if (n != NULL && idx < n->part.length())
                return n->part.substr(idx);
        }
        return "";
    }